

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants
          (ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  int iVar1;
  Type pSVar2;
  ParseNode *this_00;
  ParseNode *pPVar3;
  RegSlot RVar4;
  FuncInfo *this_01;
  FunctionBody *this_02;
  ScriptContext *scriptContext;
  ParseNodeStrTemplate *pPVar5;
  JavascriptArray *pJVar6;
  JavascriptArray *var;
  ulong uVar7;
  int iVar8;
  
  this_01 = TopFuncInfo(this);
  this_02 = FuncInfo::GetParsedFunctionBody(this_01);
  for (uVar7 = 0; uVar7 < (funcInfo->stringTemplateCallsiteRegisterMap).bucketCount;
      uVar7 = uVar7 + 1) {
    iVar8 = (funcInfo->stringTemplateCallsiteRegisterMap).buckets[uVar7];
    if (iVar8 != -1) {
      while (iVar8 != -1) {
        pSVar2 = (funcInfo->stringTemplateCallsiteRegisterMap).entries;
        RVar4 = pSVar2[iVar8].
                super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.value;
        iVar1 = pSVar2[iVar8].
                super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.next;
        this_00 = pSVar2[iVar8].
                  super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.key;
        scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_02);
        pPVar5 = ParseNode::AsParseNodeStrTemplate(this_00);
        pPVar3 = pPVar5->pnodeStringRawLiterals;
        pPVar5 = ParseNode::AsParseNodeStrTemplate(this_00);
        pJVar6 = BuildArrayFromStringList(pPVar3,(uint)pPVar5->countStringLiterals,scriptContext);
        (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])
                  (pJVar6);
        pPVar5 = ParseNode::AsParseNodeStrTemplate(this_00);
        pPVar3 = pPVar5->pnodeStringLiterals;
        pPVar5 = ParseNode::AsParseNodeStrTemplate(this_00);
        var = BuildArrayFromStringList(pPVar3,(uint)pPVar5->countStringLiterals,scriptContext);
        (*(var->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                  (var,0x12a,pJVar6,0,0,0,0xf);
        (*(var->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])
                  (var);
        RVar4 = Js::FunctionBody::MapRegSlot(this_02,RVar4);
        Js::FunctionBody::RecordConstant(this_02,RVar4,var);
        iVar8 = iVar1;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants(FuncInfo* funcInfo)
{
    Js::FunctionBody *byteCodeFunction = this->TopFuncInfo()->GetParsedFunctionBody();
    funcInfo->stringTemplateCallsiteRegisterMap.Map([byteCodeFunction](ParseNodePtr pnode, Js::RegSlot location)
    {
        Js::ScriptContext* scriptContext = byteCodeFunction->GetScriptContext();
        
        Js::RecyclableObject* rawArray = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringRawLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        rawArray->Freeze();

        Js::RecyclableObject* callsiteObject = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        callsiteObject->SetPropertyWithAttributes(Js::PropertyIds::raw, rawArray, PropertyNone, nullptr);
        callsiteObject->Freeze();

        byteCodeFunction->RecordConstant(byteCodeFunction->MapRegSlot(location), callsiteObject);
    });
}